

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_11::HasForwardReference
               (Instruction *inst,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *debug_ids,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *seen_ids)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  bool bVar2;
  size_type sVar3;
  uint32_t local_40;
  uint32_t local_3c;
  Operand *local_38;
  Operand *op;
  uint32_t i;
  uint32_t num_in_operands;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *seen_ids_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *debug_ids_local;
  Instruction *inst_local;
  
  _i = seen_ids;
  seen_ids_local = debug_ids;
  debug_ids_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)inst;
  op._4_4_ = Instruction::NumInOperands(inst);
  op._0_4_ = 0;
  do {
    if (op._4_4_ <= (uint)op) {
      return false;
    }
    local_38 = Instruction::GetInOperand((Instruction *)debug_ids_local,(uint)op);
    bVar2 = spvIsIdType(local_38->type);
    puVar1 = seen_ids_local;
    if (bVar2) {
      local_3c = Operand::AsId(local_38);
      sVar3 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(puVar1,&local_3c);
      puVar1 = _i;
      if (sVar3 != 0) {
        local_40 = Operand::AsId(local_38);
        sVar3 = std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count(puVar1,&local_40);
        if (sVar3 == 0) {
          return true;
        }
      }
    }
    op._0_4_ = (uint)op + 1;
  } while( true );
}

Assistant:

bool HasForwardReference(const Instruction& inst,
                         const std::unordered_set<uint32_t>& debug_ids,
                         const std::unordered_set<uint32_t>& seen_ids) {
  const uint32_t num_in_operands = inst.NumInOperands();
  for (uint32_t i = 0; i < num_in_operands; ++i) {
    const Operand& op = inst.GetInOperand(i);
    if (!spvIsIdType(op.type)) continue;

    if (debug_ids.count(op.AsId()) == 0) continue;

    if (seen_ids.count(op.AsId()) == 0) return true;
  }

  return false;
}